

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O2

result<unsigned_long> * __thiscall
sockpp::stream_socket::write_n
          (result<unsigned_long> *__return_storage_ptr__,stream_socket *this,void *buf,size_t n)

{
  result<unsigned_long> *prVar1;
  bool bVar2;
  ulong uVar3;
  result<unsigned_long> res;
  errc local_54;
  result<unsigned_long> *local_50;
  result<unsigned_long> local_48;
  
  uVar3 = 0;
  local_50 = __return_storage_ptr__;
  do {
    prVar1 = local_50;
    if (n <= uVar3) {
      local_50->val_ = uVar3;
      std::error_code::error_code(&local_50->err_);
      return prVar1;
    }
    (*(this->super_socket)._vptr_socket[9])(&local_48,this,(long)buf + uVar3);
    if (local_48.err_._M_value != 0) {
      local_54 = interrupted;
      bVar2 = operator!=(&local_48,&local_54);
      if (bVar2) {
        local_50->val_ = 0;
        *(ulong *)&local_50->err_ = CONCAT44(local_48.err_._4_4_,local_48.err_._M_value);
        (local_50->err_)._M_cat = local_48.err_._M_cat;
        return local_50;
      }
    }
    uVar3 = uVar3 + local_48.val_;
  } while( true );
}

Assistant:

result<size_t> stream_socket::write_n(const void* buf, size_t n) {
    const uint8_t* b = reinterpret_cast<const uint8_t*>(buf);
    size_t nx = 0;

    while (nx < n) {
        auto res = write(b + nx, n - nx);
        if (!res && res != errc::interrupted)
            return res.error();
        nx += size_t(res.value());
    }

    return nx;
}